

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O0

int arkAdaptPID(ARKodeHAdaptMem hadapt_mem,int k,realtype hcur,realtype ecur,realtype *hnew)

{
  double *in_RDX;
  double in_XMM0_Qa;
  realtype rVar1;
  realtype rVar2;
  realtype rVar3;
  realtype h_acc;
  realtype e3;
  realtype e2;
  realtype e1;
  realtype k3;
  realtype k2;
  realtype k1;
  realtype in_stack_ffffffffffffff68;
  
  rVar1 = SUNRpowerR(in_stack_ffffffffffffff68,7.70236830136955e-317);
  rVar2 = SUNRpowerR(in_stack_ffffffffffffff68,7.7023860877328e-317);
  rVar3 = SUNRpowerR(in_stack_ffffffffffffff68,7.70240387409605e-317);
  *in_RDX = in_XMM0_Qa * rVar1 * rVar2 * rVar3;
  return 0;
}

Assistant:

int arkAdaptPID(ARKodeHAdaptMem hadapt_mem, int k, realtype hcur,
                realtype ecur, realtype *hnew)
{
  realtype k1, k2, k3, e1, e2, e3, h_acc;

  /* set usable time-step adaptivity parameters */
  k1 = -hadapt_mem->k1 / k;
  k2 =  hadapt_mem->k2 / k;
  k3 = -hadapt_mem->k3 / k;
  e1 = SUNMAX(ecur, TINY);
  e2 = SUNMAX(hadapt_mem->ehist[0], TINY);
  e3 = SUNMAX(hadapt_mem->ehist[1], TINY);

  /* compute estimated optimal time step size, set into output */
  h_acc = hcur * SUNRpowerR(e1,k1) * SUNRpowerR(e2,k2) * SUNRpowerR(e3,k3);
  *hnew = h_acc;

  return(ARK_SUCCESS);
}